

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> *this)

{
  QLatin1String *pQVar1;
  QChar *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char16_t *__dest;
  char16_t *__src;
  
  if ((((this->a).a.d.ptr == (char16_t *)0x0) && ((this->a).b.m_data == (char *)0x0)) &&
     ((this->b).m_data == (char *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar3 = (this->a).b.m_size;
    lVar4 = (this->a).a.d.size;
    lVar5 = (this->b).m_size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar3 + lVar4 + lVar5,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    lVar3 = (this->a).a.d.size;
    if (lVar3 != 0) {
      __src = (this->a).a.d.ptr;
      if (__src == (char16_t *)0x0) {
        __src = (char16_t *)&QString::_empty;
      }
      memcpy(__dest,__src,lVar3 * 2);
    }
    pQVar2 = (QChar *)(__dest + lVar3);
    pQVar1 = &(this->a).b;
    lVar3 = pQVar1->m_size;
    QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar2);
    QAbstractConcatenable::appendLatin1To(this->b,pQVar2 + lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }